

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O3

FaceData * __thiscall
Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::
tryInsert(PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>
          *this,ReductionKey *key,FaceData *value,size_t *newMemUsed)

{
  ulong uVar1;
  FaceData *pFVar2;
  Entry *pEVar3;
  uint uVar4;
  Entry *pEVar5;
  uint uVar6;
  ulong uVar7;
  
  pEVar3 = lockEntriesAndGrowIfNeeded(this,newMemUsed);
  uVar4 = this->_numEntries - 1;
  uVar1 = key->_val;
  uVar6 = uVar4 & (uint)uVar1;
  pEVar5 = pEVar3 + uVar6;
  if (pEVar3[uVar6].value != (FaceData *)0x0) {
    uVar7 = uVar1 & 0xffffffff;
    do {
      do {
      } while ((pEVar5->key)._val == -1);
      if ((pEVar5->key)._val == uVar1) goto LAB_0010a5a2;
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
      uVar6 = uVar6 & uVar4;
      pEVar5 = pEVar3 + uVar6;
    } while (pEVar3[uVar6].value != (FaceData *)0x0);
  }
  pEVar5->value = value;
  this->_size = this->_size + 1;
  (pEVar5->key)._val = key->_val;
LAB_0010a5a2:
  pFVar2 = pEVar5->value;
  this->_entries = pEVar3;
  return pFVar2;
}

Assistant:

Value tryInsert(Key& key, Value value, size_t& newMemUsed)
    {
        Entry* entries = lockEntriesAndGrowIfNeeded(newMemUsed);
        uint32_t mask = _numEntries-1;
        uint32_t hash = key.hash();

        Value result = 0;
        for (uint32_t i = hash;; ++i) {
            Entry& e = entries[i & mask];
            if (e.value == 0) {
                e.value = value;
                ++_size;
                PtexMemoryFence();
                e.key.copy(key);
                result = e.value;
                break;
            }
            while (e.key.isEmpty()) ;
            if (e.key.matches(key)) {
                result = e.value;
                break;
            }
        }
        unlockEntries(entries);
        return result;
    }